

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

reference<mpt::layout::graph::world> * __thiscall
mpt::reference<mpt::layout::graph::world>::operator=
          (reference<mpt::layout::graph::world> *this,reference<mpt::layout::graph::world> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  world *local_28;
  world *r;
  reference<mpt::layout::graph::world> *ref_local;
  reference<mpt::layout::graph::world> *this_local;
  
  local_28 = ref->_ref;
  if (local_28 != this->_ref) {
    if ((local_28 != (world *)0x0) &&
       (iVar1 = (*(local_28->super_metatype).super_convertable._vptr_convertable[2])(),
       CONCAT44(extraout_var,iVar1) == 0)) {
      local_28 = (world *)0x0;
    }
    if (this->_ref != (world *)0x0) {
      (*(this->_ref->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = local_28;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}